

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Module * sqlite3VtabCreateModule
                   (sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                   _func_void_void_ptr *xDestroy)

{
  int iVar1;
  Module *pMod_00;
  Module *pMStack_50;
  int nName;
  char *zCopy;
  Module *pDel;
  Module *pMod;
  _func_void_void_ptr *xDestroy_local;
  void *pAux_local;
  sqlite3_module *pModule_local;
  char *zName_local;
  sqlite3 *db_local;
  
  if (pModule == (sqlite3_module *)0x0) {
    pDel = (Module *)0x0;
    pMStack_50 = (Module *)zName;
  }
  else {
    iVar1 = sqlite3Strlen30(zName);
    pDel = (Module *)sqlite3Malloc((long)iVar1 + 0x31);
    if (pDel == (Module *)0x0) {
      sqlite3OomFault(db);
      return (Module *)0x0;
    }
    pMStack_50 = pDel + 1;
    memcpy(pMStack_50,zName,(long)(iVar1 + 1));
    pDel->zName = (char *)pMStack_50;
    pDel->pModule = pModule;
    pDel->pAux = pAux;
    pDel->xDestroy = xDestroy;
    pDel->pEpoTab = (Table *)0x0;
    pDel->nRefModule = 1;
  }
  pMod_00 = (Module *)sqlite3HashInsert(&db->aModule,(char *)pMStack_50,pDel);
  if (pMod_00 != (Module *)0x0) {
    if (pMod_00 == pDel) {
      sqlite3OomFault(db);
      sqlite3DbFree(db,pMod_00);
      pDel = (Module *)0x0;
    }
    else {
      sqlite3VtabEponymousTableClear(db,pMod_00);
      sqlite3VtabModuleUnref(db,pMod_00);
    }
  }
  return pDel;
}

Assistant:

SQLITE_PRIVATE Module *sqlite3VtabCreateModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  Module *pMod;
  Module *pDel;
  char *zCopy;
  if( pModule==0 ){
    zCopy = (char*)zName;
    pMod = 0;
  }else{
    int nName = sqlite3Strlen30(zName);
    pMod = (Module *)sqlite3Malloc(sizeof(Module) + nName + 1);
    if( pMod==0 ){
      sqlite3OomFault(db);
      return 0;
    }
    zCopy = (char *)(&pMod[1]);
    memcpy(zCopy, zName, nName+1);
    pMod->zName = zCopy;
    pMod->pModule = pModule;
    pMod->pAux = pAux;
    pMod->xDestroy = xDestroy;
    pMod->pEpoTab = 0;
    pMod->nRefModule = 1;
  }
  pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,(void*)pMod);
  if( pDel ){
    if( pDel==pMod ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, pDel);
      pMod = 0;
    }else{
      sqlite3VtabEponymousTableClear(db, pDel);
      sqlite3VtabModuleUnref(db, pDel);
    }
  }
  return pMod;
}